

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::IfcRamp(IfcRamp *this)

{
  IfcRamp *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcRamp");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f1f960);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>,
             &PTR_construction_vtable_24__00f1fa98);
  *(undefined8 *)this = 0xf1f830;
  *(undefined8 *)&this->field_0x178 = 0xf1f948;
  *(undefined8 *)&this->field_0x88 = 0xf1f858;
  *(undefined8 *)&this->field_0x98 = 0xf1f880;
  *(undefined8 *)&this->field_0xd0 = 0xf1f8a8;
  *(undefined8 *)&this->field_0x100 = 0xf1f8d0;
  *(undefined8 *)&this->field_0x138 = 0xf1f8f8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf1f920;
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}